

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O1

void Saig_MvSimulateFrame(Saig_MvMan_t *p,int fFirst,int fVerbose)

{
  uint *puVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Saig_MvAnd_t *pSVar8;
  uchar *puVar9;
  Saig_MvAnd_t *pSVar10;
  long lVar11;
  Vec_Ptr_t *pVVar12;
  Saig_MvAnd_t *pSVar13;
  uint uVar14;
  Saig_MvObj_t *pSVar15;
  
  pSVar15 = p->pAigOld;
  do {
    uVar4 = *(uint *)&pSVar15->field_0x8 & 7;
    switch(uVar4) {
    case 0:
      goto switchD_006ba923_caseD_0;
    case 1:
      break;
    case 2:
      if (pSVar15->iFan1 == 0) {
        if (fFirst == 0) {
          uVar4 = 0xfffffff2;
        }
        else {
          if (p->nObjs == p->nObjsAlloc) {
            sVar3 = (long)p->nObjsAlloc * 0x18;
            if (p->pAigNew == (Saig_MvAnd_t *)0x0) {
              pSVar8 = (Saig_MvAnd_t *)malloc(sVar3);
            }
            else {
              pSVar8 = (Saig_MvAnd_t *)realloc(p->pAigNew,sVar3);
            }
            p->pAigNew = pSVar8;
            sVar3 = (long)p->nObjsAlloc * 2;
            if (p->pLevels == (uchar *)0x0) {
              puVar9 = (uchar *)malloc(sVar3);
            }
            else {
              puVar9 = (uchar *)realloc(p->pLevels,sVar3);
            }
            p->pLevels = puVar9;
            p->nObjsAlloc = p->nObjsAlloc << 1;
          }
          pSVar10 = p->pAigNew;
          iVar7 = p->nObjs;
          pSVar8 = pSVar10 + iVar7;
          pSVar8->iFan0 = 0;
          pSVar8->iFan1 = 0;
          pSVar10[iVar7].iNext = 0;
          p->pLevels[iVar7] = '\0';
          p->nPis = p->nPis + 1;
          iVar7 = p->nObjs;
          p->nObjs = iVar7 + 1;
          uVar4 = *(uint *)&pSVar15->field_0x8 & 7 | iVar7 << 4;
        }
        break;
      }
      goto switchD_006ba923_caseD_0;
    case 3:
      uVar14 = *(uint *)&p->pAigOld[pSVar15->iFan0 >> 1].field_0x8 >> 3;
      uVar5 = (pSVar15->iFan0 & 1U ^ uVar14) << 3;
      if (uVar14 == 0x1ffffffe) {
        uVar5 = 0xfffffff0;
      }
      uVar4 = uVar5 | uVar4;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                    ,0x1d0,"void Saig_MvSimulateFrame(Saig_MvMan_t *, int, int)");
    case 5:
      uVar14 = *(uint *)&p->pAigOld[pSVar15->iFan0 >> 1].field_0x8 >> 3;
      uVar4 = pSVar15->iFan0 & 1U ^ uVar14;
      if (uVar14 == 0x1ffffffe) {
        uVar4 = 0x1ffffffe;
      }
      uVar5 = *(uint *)&p->pAigOld[pSVar15->iFan1 >> 1].field_0x8 >> 3;
      uVar14 = pSVar15->iFan1 & 1U ^ uVar5;
      if (uVar5 == 0x1ffffffe) {
        uVar14 = 0x1ffffffe;
      }
      uVar5 = uVar4;
      if ((uVar4 != uVar14) && (uVar5 = 1, (uVar14 ^ uVar4) != 1)) {
        if (uVar4 < 2) {
          uVar5 = uVar14;
          if (uVar4 != 0) {
            uVar5 = 1;
          }
        }
        else if (uVar14 < 2) {
          uVar5 = uVar4;
          if (uVar14 != 0) {
            uVar5 = 1;
          }
        }
        else {
          uVar5 = 0x1ffffffe;
          if (((uVar4 != 0x1ffffffe) && (fFirst != 0)) && (uVar14 != 0x1ffffffe)) {
            uVar5 = uVar14;
            if (uVar14 < uVar4) {
              uVar5 = uVar4;
            }
            if (uVar4 < uVar14) {
              uVar14 = uVar4;
            }
            if (uVar5 <= uVar14) {
              __assert_fail("iFan0 < iFan1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                            ,0x11d,"int Saig_MvHash(int, int, int)");
            }
            uVar4 = 0;
            if ((uVar14 & 1) != 0) {
              uVar4 = 0x38f;
            }
            uVar6 = 0;
            if ((uVar5 & 1) != 0) {
              uVar6 = 0x161;
            }
            uVar2 = (ulong)(uVar6 ^ (uVar5 >> 1) * 0xb9b ^ uVar4 ^ (uVar14 >> 1) * 0x1f01) %
                    (ulong)(uint)p->nTNodesSize;
            lVar11 = (long)p->pTNodes[uVar2];
            if (lVar11 == 0) {
              pSVar8 = (Saig_MvAnd_t *)0x0;
            }
            else {
              pSVar8 = p->pAigNew + lVar11;
            }
            pSVar10 = (Saig_MvAnd_t *)(p->pTNodes + uVar2);
            while ((pSVar8 != (Saig_MvAnd_t *)0x0 &&
                   ((pSVar8->iFan0 != uVar14 || (pSVar8->iFan1 != uVar5))))) {
              if ((long)pSVar8->iNext == 0) {
                pSVar13 = (Saig_MvAnd_t *)0x0;
              }
              else {
                pSVar13 = p->pAigNew + pSVar8->iNext;
              }
              pSVar10 = (Saig_MvAnd_t *)&pSVar8->iNext;
              pSVar8 = pSVar13;
            }
            if (pSVar10->iFan0 == 0) {
              pSVar8 = p->pAigNew;
              if ((pSVar10 < pSVar8) || (pSVar8 + p->nObjsAlloc <= pSVar10)) {
                iVar7 = Saig_MvCreateObj(p,uVar14,uVar5);
                pSVar10->iFan0 = iVar7;
                goto LAB_006bac23;
              }
              iVar7 = Saig_MvCreateObj(p,uVar14,uVar5);
              (&p->pAigNew->iFan0)[(int)((ulong)((long)pSVar10 - (long)pSVar8) >> 2)] = iVar7;
            }
            else {
LAB_006bac23:
              iVar7 = pSVar10->iFan0;
            }
            uVar5 = iVar7 * 2;
          }
        }
      }
      uVar4 = (*(uint *)&pSVar15->field_0x8 & 7) + uVar5 * 8;
      break;
    case 7:
      pVVar12 = p->vFlops;
      if (0 < pVVar12->nSize) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)pVVar12->pArray[lVar11];
          uVar4 = *(uint *)&p->pAigOld[(int)*puVar1 >> 1].field_0x8 >> 3;
          uVar14 = 0xfffffff0;
          if (uVar4 != 0x1ffffffe) {
            uVar14 = (uVar4 ^ *puVar1 & 1) << 3;
          }
          puVar1[2] = puVar1[2] & 7 | uVar14;
          lVar11 = lVar11 + 1;
          pVVar12 = p->vFlops;
        } while (lVar11 < pVVar12->nSize);
      }
      return;
    }
    *(uint *)&pSVar15->field_0x8 = uVar4;
switchD_006ba923_caseD_0:
    pSVar15 = pSVar15 + 1;
  } while( true );
}

Assistant:

void Saig_MvSimulateFrame( Saig_MvMan_t * p, int fFirst, int fVerbose )
{
    Saig_MvObj_t * pEntry;
    int i;
    Saig_MvManForEachObj( p->pAigOld, pEntry )
    {
        if ( pEntry->Type == AIG_OBJ_AND )
        {
            pEntry->Value = Saig_MvAnd( p, 
                Saig_MvSimulateValue0(p->pAigOld, pEntry),
                Saig_MvSimulateValue1(p->pAigOld, pEntry), fFirst );
        }
        else if ( pEntry->Type == AIG_OBJ_CO )
            pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        else if ( pEntry->Type == AIG_OBJ_CI )
        {
            if ( pEntry->iFan1 == 0 ) // true PI
            {
                if ( fFirst )
                    pEntry->Value = Saig_MvVar2Lit( Saig_MvCreateObj( p, 0, 0 ) );
                else
                    pEntry->Value = SAIG_UNDEF_VALUE;
            }
//            else if ( fFirst ) // register output
//                pEntry->Value = Saig_MvConst0();
//            else
//                pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        }
        else if ( pEntry->Type == AIG_OBJ_CONST1 )
            pEntry->Value = Saig_MvConst1();
        else if ( pEntry->Type != AIG_OBJ_NONE )
            assert( 0 );
    }
    // transfer to registers
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
        pEntry->Value = Saig_MvSimulateValue0( p->pAigOld, pEntry );
}